

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O1

void lejp_check_path_match(lejp_ctx *ctx)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  
  sVar6 = 8;
  if (ctx->path_stride != 0) {
    sVar6 = ctx->path_stride;
  }
  if (ctx->path_match != '\0') {
    return;
  }
  bVar1 = ctx->pst_sp;
  bVar2 = ctx->pst[bVar1].count_paths;
  uVar8 = 0;
  do {
    if (uVar8 == bVar2) {
      ctx->wildcount = '\0';
      return;
    }
    ctx->wildcount = '\0';
    pcVar7 = *(char **)((long)ctx->pst[bVar1].paths + sVar6 * uVar8);
    cVar3 = ctx->path[0];
    pcVar9 = ctx->path;
    while (cVar3 != '\0') {
      cVar4 = *pcVar7;
      if (cVar4 == '*') {
        bVar5 = ctx->wildcount;
        ctx->wildcount = bVar5 + 1;
        ctx->wild[bVar5] = (short)pcVar9 - (short)ctx->path;
        do {
          if (*pcVar9 == '.') {
            if (pcVar7[1] != '\0') goto LAB_001055aa;
          }
          else if (*pcVar9 == '\0') goto LAB_001055aa;
          pcVar9 = pcVar9 + 1;
        } while( true );
      }
      if ((cVar4 == '\0') || (cVar3 != cVar4)) {
        if (cVar3 != '\0') goto LAB_00105601;
        break;
      }
      pcVar9 = pcVar9 + 1;
LAB_001055aa:
      pcVar7 = pcVar7 + 1;
      cVar3 = *pcVar9;
    }
    if (*pcVar7 == '\0') {
      ctx->path_match = (char)uVar8 + '\x01';
      ctx->path_match_len = ctx->pst[bVar1].ppos;
      return;
    }
LAB_00105601:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void
lejp_check_path_match(struct lejp_ctx *ctx)
{
	const char *p, *q;
	int n;
	size_t s = sizeof(char *);

	if (ctx->path_stride)
		s = ctx->path_stride;

	/* we only need to check if a match is not active */
	for (n = 0; !ctx->path_match &&
	     n < ctx->pst[ctx->pst_sp].count_paths; n++) {
		ctx->wildcount = 0;
		p = ctx->path;

		q = *((char **)(((char *)ctx->pst[ctx->pst_sp].paths) + (n * s)));

		while (*p && *q) {
			if (*q != '*') {
				if (*p != *q)
					break;
				p++;
				q++;
				continue;
			}
			ctx->wild[ctx->wildcount++] = lws_ptr_diff(p, ctx->path);
			q++;
			/*
			 * if * has something after it, match to .
			 * if ends with *, eat everything.
			 * This implies match sequences must be ordered like
			 *  x.*.*
			 *  x.*
			 * if both options are possible
			 */
			while (*p && (*p != '.' || !*q))
				p++;
		}
		if (*p || *q)
			continue;

		ctx->path_match = n + 1;
		ctx->path_match_len = ctx->pst[ctx->pst_sp].ppos;
		return;
	}

	if (!ctx->path_match)
		ctx->wildcount = 0;
}